

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O0

int cuddSwapping(DdManager *table,int lower,int upper,Cudd_ReorderingType heuristic)

{
  uint uVar1;
  Move *pMVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int result;
  int modulo;
  int pivot;
  Move *move;
  Move *moves;
  int previousSize;
  int iterate;
  int y;
  int x;
  int nvars;
  int keys;
  int max;
  int j;
  int i;
  Cudd_ReorderingType heuristic_local;
  int upper_local;
  int lower_local;
  DdManager *table_local;
  
  result = -1;
  iVar3 = (upper - lower) + 1;
  max = 0;
  while( true ) {
    if ((iVar3 <= max) || (table->siftMaxSwap <= ddTotalNumberSwapping)) {
      return 1;
    }
    if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
      nvars = -1;
      for (keys = lower; keys <= upper; keys = keys + 1) {
        uVar1 = table->subtables[keys].keys;
        if (nvars < (int)uVar1) {
          result = keys;
          nvars = uVar1;
        }
      }
      if (upper - result == 0) {
        previousSize = result;
      }
      else {
        uVar5 = Cudd_Random();
        previousSize = result + 1 +
                       (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff)
                            % (long)(upper - result));
      }
      iVar4 = (result - lower) + -1;
      iterate = lower;
      if (0 < iVar4) {
        do {
          uVar5 = Cudd_Random();
          iterate = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                         (long)iVar4);
        } while (iterate == previousSize);
      }
    }
    else {
      uVar5 = Cudd_Random();
      iterate = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                     (long)iVar3) + lower;
      do {
        uVar5 = Cudd_Random();
        previousSize = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff)
                            % (long)iVar3) + lower;
      } while (iterate == previousSize);
    }
    uVar1 = table->keys;
    iVar4 = table->isolated;
    move = ddSwapAny(table,iterate,previousSize);
    if ((move == (Move *)0x0) || (iVar4 = ddSiftingBackward(table,uVar1 - iVar4,move), iVar4 == 0))
    break;
    while (move != (Move *)0x0) {
      pMVar2 = move->next;
      move->y = 0;
      *(DdNode **)&move->flags = table->nextFree;
      table->nextFree = (DdNode *)move;
      move = pMVar2;
    }
    max = max + 1;
  }
  while (move != (Move *)0x0) {
    pMVar2 = move->next;
    move->y = 0;
    *(DdNode **)&move->flags = table->nextFree;
    table->nextFree = (DdNode *)move;
    move = pMVar2;
  }
  return 0;
}

Assistant:

int
cuddSwapping(
  DdManager * table,
  int lower,
  int upper,
  Cudd_ReorderingType heuristic)
{
    int i, j;
    int max, keys;
    int nvars;
    int x, y;
    int iterate;
    int previousSize;
    Move *moves, *move;
    int pivot = -1;
    int modulo;
    int result;

#ifdef DD_DEBUG
    /* Sanity check */
    assert(lower >= 0 && upper < table->size && lower <= upper);
#endif

    nvars = upper - lower + 1;
    iterate = nvars;

    for (i = 0; i < iterate; i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
            max = -1;
            for (j = lower; j <= upper; j++) {
                if ((keys = table->subtables[j].keys) > max) {
                    max = keys;
                    pivot = j;
                }
            }

            modulo = upper - pivot;
            if (modulo == 0) {
                y = pivot;
            } else{
                y = pivot + 1 + ((int) Cudd_Random() % modulo);
            }

            modulo = pivot - lower - 1;
            if (modulo < 1) {
                x = lower;
            } else{
                do {
                    x = (int) Cudd_Random() % modulo;
                } while (x == y);
            }
        } else {
            x = ((int) Cudd_Random() % nvars) + lower;
            do {
                y = ((int) Cudd_Random() % nvars) + lower;
            } while (x == y);
        }
        previousSize = table->keys - table->isolated;
        moves = ddSwapAny(table,x,y);
        if (moves == NULL) goto cuddSwappingOutOfMem;
        result = ddSiftingBackward(table,previousSize,moves);
        if (!result) goto cuddSwappingOutOfMem;
        while (moves != NULL) {
            move = moves->next;
            cuddDeallocMove(table, moves);
            moves = move;
        }
#ifdef DD_STATS
        if (table->keys < (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"-");
        } else if (table->keys > (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"+");     /* should never happen */
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
#if 0
        (void) fprintf(table->out,"#:t_SWAPPING %8d: tmp size\n",
                       table->keys - table->isolated);
#endif
    }

    return(1);

cuddSwappingOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(0);

}